

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

bool __thiscall QJsonPrivate::Parser::parseArray(Parser *this)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  QCborContainerPrivate *ptr;
  
  iVar1 = this->nestingLevel;
  this->nestingLevel = iVar1 + 1;
  if (iVar1 < 0x400) {
    bVar2 = eatSpace(this);
    if (bVar2) {
      if (*this->json == ']') {
        nextToken(this);
LAB_00114549:
        this->nestingLevel = this->nestingLevel + -1;
        return true;
      }
      do {
        bVar2 = eatSpace(this);
        if (!bVar2) goto LAB_001145cc;
        if ((this->container).d.ptr == (QCborContainerPrivate *)0x0) {
          ptr = (QCborContainerPrivate *)operator_new(0x40);
          (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i = 0;
          ptr->usedData = 0;
          (ptr->data).d.d = (Data *)0x0;
          (ptr->data).d.ptr = (char *)0x0;
          (ptr->data).d.size = 0;
          (ptr->elements).d.d = (Data *)0x0;
          (ptr->elements).d.ptr = (Element *)0x0;
          (ptr->elements).d.size = 0;
          QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->container,ptr);
        }
        bVar2 = parseValueIntoContainer(this);
        if (!bVar2) {
          return false;
        }
        cVar3 = nextToken(this);
      } while (cVar3 == ',');
      if (cVar3 == ']') goto LAB_00114549;
      bVar2 = eatSpace(this);
      if (bVar2) {
        this->lastError = MissingValueSeparator;
        return false;
      }
    }
LAB_001145cc:
    this->lastError = UnterminatedArray;
  }
  else {
    this->lastError = DeepNesting;
  }
  return false;
}

Assistant:

bool Parser::parseArray()
{
    if (++nestingLevel > nestingLimit) {
        lastError = QJsonParseError::DeepNesting;
        return false;
    }

    if (!eatSpace()) {
        lastError = QJsonParseError::UnterminatedArray;
        return false;
    }
    if (*json == EndArray) {
        nextToken();
    } else {
        while (1) {
            if (!eatSpace()) {
                lastError = QJsonParseError::UnterminatedArray;
                return false;
            }
            if (!container)
                container = new QCborContainerPrivate;

            if (!parseValueIntoContainer())
                return false;

            char token = nextToken();
            if (token == EndArray)
                break;
            else if (token != ValueSeparator) {
                if (!eatSpace())
                    lastError = QJsonParseError::UnterminatedArray;
                else
                    lastError = QJsonParseError::MissingValueSeparator;
                return false;
            }
        }
    }

    --nestingLevel;

    return true;
}